

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

void os_rand(long *val)

{
  int iVar1;
  unsigned_long __res;
  ulong uVar2;
  
  if (os_rand::rdev == '\0') {
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      uVar2 = time((time_t *)0x0);
      os_rand::rdev._M_x = uVar2 % 0x7fffffff + (ulong)(uVar2 % 0x7fffffff == 0);
      __cxa_guard_release(&os_rand::rdev);
    }
  }
  os_rand::rdev._M_x = (os_rand::rdev._M_x * 0x41a7) % 0x7fffffff;
  *val = os_rand::rdev._M_x;
  return;
}

Assistant:

void
os_rand( long* val )
{
    static std::default_random_engine rdev(time(0));
    *val = rdev();
}